

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall cmInstallExportGenerator::GenerateScript(cmInstallExportGenerator *this,ostream *os)

{
  cmExportInstallFileGenerator *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar2;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *this_01;
  ostream *poVar3;
  string *psVar4;
  char *mainFile;
  ulong uVar5;
  reference config;
  string *c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_1e0;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream e;
  ostream *os_local;
  cmInstallExportGenerator *this_local;
  
  this_01 = cmExportSet::GetTargetExports(this->ExportSet);
  bVar2 = std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::empty(this_01);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar3 = std::operator<<((ostream *)local_190,"INSTALL(EXPORT) given unknown export \"");
    psVar4 = cmExportSet::GetName_abi_cxx11_(this->ExportSet);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,"\"");
    std::__cxx11::ostringstream::str();
    cmSystemTools::Error(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  else {
    ComputeTempDir(this);
    cmsys::SystemTools::MakeDirectory(&this->TempDir,(mode_t *)0x0);
    std::__cxx11::string::operator=((string *)&this->MainImportFile,(string *)&this->TempDir);
    std::__cxx11::string::operator+=((string *)&this->MainImportFile,"/");
    std::__cxx11::string::operator+=((string *)&this->MainImportFile,(string *)&this->FileName);
    pcVar1 = this->EFGen;
    mainFile = (char *)std::__cxx11::string::c_str();
    cmExportFileGenerator::SetExportFile(&pcVar1->super_cmExportFileGenerator,mainFile);
    cmExportFileGenerator::SetNamespace(&this->EFGen->super_cmExportFileGenerator,&this->Namespace);
    cmExportFileGenerator::SetExportOld
              (&this->EFGen->super_cmExportFileGenerator,(bool)(this->ExportOld & 1));
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationTypes);
    if (bVar2) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        cmExportFileGenerator::AddConfiguration
                  (&this->EFGen->super_cmExportFileGenerator,
                   &(this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationName);
      }
      else {
        pcVar1 = this->EFGen;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e0,"",(allocator<char> *)((long)&__range2 + 7));
        cmExportFileGenerator::AddConfiguration(&pcVar1->super_cmExportFileGenerator,&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      }
    }
    else {
      this_00 = (this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationTypes;
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_00);
      c = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&c), bVar2) {
        config = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        cmExportFileGenerator::AddConfiguration(&this->EFGen->super_cmExportFileGenerator,config);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
    }
    cmExportFileGenerator::GenerateImportFile(&this->EFGen->super_cmExportFileGenerator);
    cmInstallGenerator::GenerateScript(&this->super_cmInstallGenerator,os);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScript(std::ostream& os)
{
  // Skip empty sets.
  if (ExportSet->GetTargetExports()->empty()) {
    std::ostringstream e;
    e << "INSTALL(EXPORT) given unknown export \"" << ExportSet->GetName()
      << "\"";
    cmSystemTools::Error(e.str());
    return;
  }

  // Create the temporary directory in which to store the files.
  this->ComputeTempDir();
  cmSystemTools::MakeDirectory(this->TempDir);

  // Construct a temporary location for the file.
  this->MainImportFile = this->TempDir;
  this->MainImportFile += "/";
  this->MainImportFile += this->FileName;

  // Generate the import file for this export set.
  this->EFGen->SetExportFile(this->MainImportFile.c_str());
  this->EFGen->SetNamespace(this->Namespace);
  this->EFGen->SetExportOld(this->ExportOld);
  if (this->ConfigurationTypes->empty()) {
    if (!this->ConfigurationName.empty()) {
      this->EFGen->AddConfiguration(this->ConfigurationName);
    } else {
      this->EFGen->AddConfiguration("");
    }
  } else {
    for (std::string const& c : *this->ConfigurationTypes) {
      this->EFGen->AddConfiguration(c);
    }
  }
  this->EFGen->GenerateImportFile();

  // Perform the main install script generation.
  this->cmInstallGenerator::GenerateScript(os);
}